

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPN::Mix(OPN *this,Sample *buffer,int nsamples)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ISample IVar4;
  int local_34;
  Sample *pSStack_30;
  ISample s;
  Sample *dest;
  Sample *limit;
  int actch;
  int nsamples_local;
  Sample *buffer_local;
  OPN *this_local;
  
  PSG::Mix(&(this->super_OPNBase).psg,buffer,nsamples);
  Channel4::SetFNum((Channel4 *)&this->field_0x1d8,this->fnum[0]);
  Channel4::SetFNum((Channel4 *)&this->field_0x4b8,this->fnum[1]);
  if (((this->super_OPNBase).super_Timer.regtc & 0xc0) == 0) {
    Channel4::SetFNum((Channel4 *)&this->field_0x798,this->fnum[2]);
  }
  else {
    Operator::SetFNum((Operator *)&this->field_0x7f8,this->fnum3[1]);
    Operator::SetFNum((Operator *)&this->field_0x898,this->fnum3[2]);
    Operator::SetFNum((Operator *)&this->field_0x938,this->fnum3[0]);
    Operator::SetFNum((Operator *)&this->field_0x9d8,this->fnum[2]);
  }
  iVar1 = Channel4::Prepare((Channel4 *)&this->field_0x798);
  uVar2 = Channel4::Prepare((Channel4 *)&this->field_0x4b8);
  uVar3 = Channel4::Prepare((Channel4 *)&this->field_0x1d8);
  uVar2 = (iVar1 << 2 | uVar2) << 2 | uVar3;
  if ((uVar2 & 0x15) != 0) {
    for (pSStack_30 = buffer; pSStack_30 < buffer + (nsamples << 1); pSStack_30 = pSStack_30 + 2) {
      local_34 = 0;
      if ((uVar3 & 1) != 0) {
        local_34 = Channel4::Calc((Channel4 *)&this->field_0x1d8);
      }
      if ((uVar2 & 4) != 0) {
        IVar4 = Channel4::Calc((Channel4 *)&this->field_0x4b8);
        local_34 = IVar4 + local_34;
      }
      if ((uVar2 & 0x10) != 0) {
        IVar4 = Channel4::Calc((Channel4 *)&this->field_0x798);
        local_34 = IVar4 + local_34;
      }
      iVar1 = Limit(local_34,0x7fff,-0x8000);
      iVar1 = iVar1 * (this->super_OPNBase).fmvolume >> 0xe;
      StoreSample(pSStack_30,iVar1);
      StoreSample(pSStack_30 + 1,iVar1);
    }
  }
  return;
}

Assistant:

void OPN::Mix(Sample* buffer, int nsamples)
{
//printf("M:%d\n",nsamples);
#define IStoSample(s)	((Limit(s, 0x7fff, -0x8000) * fmvolume) >> 14)

	psg.Mix(buffer, nsamples);

	// Set F-Number
	ch[0].SetFNum(fnum[0]);
	ch[1].SetFNum(fnum[1]);
	if (!(regtc & 0xc0))
		ch[2].SetFNum(fnum[2]);
	else
	{	// ���ʉ�
		ch[2].op[0].SetFNum(fnum3[1]);
		ch[2].op[1].SetFNum(fnum3[2]);
		ch[2].op[2].SetFNum(fnum3[0]);
		ch[2].op[3].SetFNum(fnum[2]);
	}

	int actch = (((ch[2].Prepare() << 2) | ch[1].Prepare()) << 2) | ch[0].Prepare();
//printf("a %X\n",actch);
	if (actch & 0x15)
	{
		Sample* limit = buffer + nsamples * 2;
		for (Sample* dest = buffer; dest < limit; dest+=2)
		{
			ISample s = 0;
			if (actch & 0x01) s  = ch[0].Calc();
			if (actch & 0x04) s += ch[1].Calc();
			if (actch & 0x10) s += ch[2].Calc();
			s = IStoSample(s);
			StoreSample(dest[0], s);
			StoreSample(dest[1], s);
//printf("%08X,%08X\n",dest[0],dest[1]);
		}
	}
#undef IStoSample
}